

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Client::~Client(Client *this)

{
  close(this->sockfd);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Client::~Client()
{
    close(sockfd);
}